

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_helper.hpp
# Opt level: O3

void __thiscall TempFile::TempFile(TempFile *this,string *name)

{
  pointer pcVar1;
  int iVar2;
  runtime_error *this_00;
  stat buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  stat local_b0;
  
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  iVar2 = stat((this->_name)._M_dataplus._M_p,&local_b0);
  if (iVar2 == 0) {
    std::operator+(&local_d0,"Path already exists: ",&this->_name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_d0._M_string_length != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(string *)this);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

TempFile(std::string name) : _name(name) {
        if(!CLI::NonexistentPath(_name).empty())
            throw std::runtime_error(_name);
    }